

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O0

Move<vk::VkCommandBuffer_s_*> *
vkt::drawutil::makeCommandBuffer
          (Move<vk::VkCommandBuffer_s_*> *__return_storage_ptr__,DeviceInterface *vk,VkDevice device
          ,VkCommandPool commandPool)

{
  undefined1 local_48 [8];
  VkCommandBufferAllocateInfo info;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkCommandPool commandPool_local;
  
  local_48._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  info._4_4_ = 0;
  info.commandPool.m_internal._0_4_ = 0;
  info.commandPool.m_internal._4_4_ = 1;
  info.pNext = (void *)commandPool.m_internal;
  info._24_8_ = device;
  ::vk::allocateCommandBuffer
            (__return_storage_ptr__,vk,device,(VkCommandBufferAllocateInfo *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Move<VkCommandBuffer> makeCommandBuffer (const DeviceInterface& vk, const VkDevice device, const VkCommandPool commandPool)
{
	const VkCommandBufferAllocateInfo info =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,		// VkStructureType		sType;
		DE_NULL,											// const void*			pNext;
		commandPool,										// VkCommandPool		commandPool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,					// VkCommandBufferLevel	level;
		1u,													// deUint32				commandBufferCount;
	};
	return allocateCommandBuffer(vk, device, &info);
}